

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

string * __thiscall
pfederc::ArrayLitExpr::toString_abi_cxx11_(string *__return_storage_ptr__,ArrayLitExpr *this)

{
  bool bVar1;
  reference this_00;
  pointer pEVar2;
  string local_58 [32];
  _Self local_38;
  _Self local_30;
  _Self local_28;
  const_iterator it;
  ArrayLitExpr *this_local;
  string *result;
  
  it._M_node._7_1_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"[",(allocator<char> *)((long)&it._M_node + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_node + 6));
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
       ::begin(&this->exprs);
  while( true ) {
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
         ::end(&this->exprs);
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
         ::begin(&this->exprs);
    bVar1 = std::operator!=(&local_28,&local_38);
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    }
    this_00 = std::
              _List_const_iterator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>
              ::operator*(&local_28);
    pEVar2 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                       (this_00);
    (*pEVar2->_vptr_Expr[2])();
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_58);
    std::__cxx11::string::~string(local_58);
    std::_List_const_iterator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>
    ::operator++(&local_28);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,']');
  return __return_storage_ptr__;
}

Assistant:

std::string ArrayLitExpr::toString() const noexcept {
  std::string result = "[";
  for (auto it = exprs.begin(); it != exprs.end(); ++it) {
    if (it != exprs.begin())
      result += ", ";

    result += (*it)->toString();
  }

  result += ']';

  return result;
}